

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::DebugNodeTableSettings(ImGuiTableSettings *settings)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  byte *pbVar6;
  ulong uVar7;
  
  bVar2 = TreeNode((void *)(ulong)settings->ID,"Settings 0x%08X (%d columns)",
                   (void *)(ulong)settings->ID,(ulong)(uint)(int)settings->ColumnsCount);
  if (bVar2) {
    BulletText("SaveFlags: 0x%08X",(ulong)(uint)settings->SaveFlags);
    BulletText("ColumnsCount: %d (max %d)",(ulong)(uint)(int)settings->ColumnsCount,
               (ulong)(uint)(int)settings->ColumnsCountMax);
    pbVar6 = (byte *)((long)&settings[1].RefScale + 3);
    for (uVar7 = 0; (long)uVar7 < (long)settings->ColumnsCount; uVar7 = uVar7 + 1) {
      bVar1 = *pbVar6;
      uVar3 = 0xffffffffffffffff;
      pcVar4 = "---";
      if ((int)(char)pbVar6[-1] != 0xffffffff) {
        pcVar4 = "---";
        if ((bVar1 & 3) == 2) {
          pcVar4 = "Des";
        }
        if ((bVar1 & 3) == 1) {
          pcVar4 = "Asc";
        }
        uVar3 = (ulong)(uint)(int)(char)pbVar6[-1];
      }
      pcVar5 = "Weight";
      if ((bVar1 & 8) == 0) {
        pcVar5 = "Width ";
      }
      BulletText("Column %d Order %d SortOrder %d %s Vis %d %s %7.3f UserID 0x%08X",
                 (double)*(float *)(pbVar6 + -0xb),uVar7 & 0xffffffff,
                 (ulong)(uint)(int)(char)pbVar6[-2],uVar3,pcVar4,(ulong)(bVar1 >> 2 & 1),pcVar5,
                 (ulong)*(uint *)(pbVar6 + -7));
      pbVar6 = pbVar6 + 0xc;
    }
    TreePop();
    return;
  }
  return;
}

Assistant:

void ImGui::DebugNodeTableSettings(ImGuiTableSettings* settings)
{
    if (!TreeNode((void*)(intptr_t)settings->ID, "Settings 0x%08X (%d columns)", settings->ID, settings->ColumnsCount))
        return;
    BulletText("SaveFlags: 0x%08X", settings->SaveFlags);
    BulletText("ColumnsCount: %d (max %d)", settings->ColumnsCount, settings->ColumnsCountMax);
    for (int n = 0; n < settings->ColumnsCount; n++)
    {
        ImGuiTableColumnSettings* column_settings = &settings->GetColumnSettings()[n];
        ImGuiSortDirection sort_dir = (column_settings->SortOrder != -1) ? (ImGuiSortDirection)column_settings->SortDirection : ImGuiSortDirection_None;
        BulletText("Column %d Order %d SortOrder %d %s Vis %d %s %7.3f UserID 0x%08X",
            n, column_settings->DisplayOrder, column_settings->SortOrder,
            (sort_dir == ImGuiSortDirection_Ascending) ? "Asc" : (sort_dir == ImGuiSortDirection_Descending) ? "Des" : "---",
            column_settings->IsEnabled, column_settings->IsStretch ? "Weight" : "Width ", column_settings->WidthOrWeight, column_settings->UserID);
    }
    TreePop();
}